

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2DArray(GatherBase *this,int slices,int data_slice)

{
  GLint level;
  bool bVar1;
  GLenum internal_format_00;
  GLenum format_00;
  reference pixels_00;
  undefined1 local_b8 [8];
  Vec4 data [4];
  allocator<tcu::Vector<float,_4>_> local_59;
  Vector<float,_4> local_58;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  int local_28;
  int i;
  GLint size;
  GLint csize;
  GLenum format;
  GLenum internal_format;
  int data_slice_local;
  int slices_local;
  GatherBase *this_local;
  
  internal_format_00 =
       (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  format_00 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])();
  local_28 = 0x20;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             this->tex);
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (; 0 < local_28; local_28 = local_28 / 2) {
    tcu::Vector<float,_4>::Vector(&local_58,1.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_59);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48,
               (long)(local_28 * local_28 * slices),&local_58,&local_59);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_59);
    level = pixels.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pixels_00 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_48,0);
    glu::CallLogWrapper::glTexImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
               level,internal_format_00,local_28,local_28,slices,0,format_00,0x1406,pixels_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48);
    pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_b8,0.75,0.8125,0.875,0.9375);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[0].m_data + 2),0.5,0.5625,0.625,0.6875);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[1].m_data + 2),0.0,0.0625,0.125,0.1875);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[2].m_data + 2),0.25,0.3125,0.375,0.4375);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,
             0x16,0x19,data_slice,2,2,1,format_00,0x1406,local_b8);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,
             0x10,10,data_slice,1,1,1,format_00,0x1406,local_b8);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,
             0xb,2,data_slice,1,1,1,format_00,0x1406,data[0].m_data + 2);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,
             0x18,0xd,data_slice,1,1,1,format_00,0x1406,data[1].m_data + 2);
  glu::CallLogWrapper::glTexSubImage3D
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,0,9
             ,0xe,data_slice,1,1,1,format_00,0x1406,data[2].m_data + 2);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
             0x8072,0x812f);
  bVar1 = IsFloatingPointTexture(this,internal_format_00);
  if (bVar1) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
               0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8c1a,
               0x2801,0x2700);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2DArray(int slices, int data_slice)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size * slices, Vec4(1.0));
			glTexImage3D(GL_TEXTURE_2D_ARRAY, i, internal_format, size, size, slices, 0, format, GL_FLOAT, &pixels[0]);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 22, 25, data_slice, 2, 2, 1, format, GL_FLOAT, data);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 16, 10, data_slice, 1, 1, 1, format, GL_FLOAT, data + 0);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 11, 2, data_slice, 1, 1, 1, format, GL_FLOAT, data + 1);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 24, 13, data_slice, 1, 1, 1, format, GL_FLOAT, data + 2);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 9, 14, data_slice, 1, 1, 1, format, GL_FLOAT, data + 3);

		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}